

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[36],char_const*,char_const(&)[9],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [36],char **params_1,
          char (*params_2) [9],String *params_3,String *params_4,char *params_5)

{
  char (*value) [36];
  char **value_00;
  char (*value_01) [9];
  String *pSVar1;
  char *value_02;
  String *__return_storage_ptr___00;
  char local_89 [1];
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  ArrayPtr<const_char> local_68;
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  String *local_38;
  String *params_local_4;
  String *params_local_3;
  char (*params_local_2) [9];
  char **params_local_1;
  char (*params_local) [36];
  
  __return_storage_ptr___00 = __return_storage_ptr__;
  local_38 = params_3;
  params_local_4 = (String *)params_2;
  params_local_3 = (String *)params_1;
  params_local_2 = (char (*) [9])params;
  params_local_1 = (char **)this;
  params_local = (char (*) [36])__return_storage_ptr__;
  value = ::const((char (*) [36])this);
  local_48 = toCharSequence<char_const(&)[36]>(value);
  value_00 = fwd<char_const*>((NoInfer<const_char_*> *)params_local_2);
  local_58 = toCharSequence<char_const*>(value_00);
  value_01 = ::const((char (*) [9])params_local_3);
  local_68 = toCharSequence<char_const(&)[9]>(value_01);
  pSVar1 = fwd<kj::String>(params_local_4);
  local_78 = toCharSequence<kj::String>(pSVar1);
  pSVar1 = fwd<kj::String>(local_38);
  local_88 = toCharSequence<kj::String>(pSVar1);
  value_02 = fwd<char>((NoInfer<char> *)params_4);
  local_89[0] = (char)toCharSequence<char>(value_02);
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr___00,(_ *)&local_48,&local_58,&local_68,&local_78,&local_88,
             (ArrayPtr<const_char> *)local_89,(FixedArray<char,_1UL> *)__return_storage_ptr___00);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}